

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoardsuperblockheader.h
# Opt level: O0

size_t __thiscall
Hoard::HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::BigHeap>::getSize
          (HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::BigHeap> *this,void *ptr)

{
  ulong uVar1;
  size_t newSize;
  size_t offset;
  void *ptr_local;
  HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::BigHeap> *this_local;
  
  uVar1 = (long)ptr - (long)this->_start;
  if ((this->_objectSizeIsPowerOfTwo & 1U) == 0) {
    newSize = this->_objectSize - uVar1 % this->_objectSize;
  }
  else {
    newSize = this->_objectSize - (uVar1 & this->_objectSize - 1);
  }
  return newSize;
}

Assistant:

size_t getSize (void * ptr) const {
      assert (isValid());
      auto offset = (size_t) ptr - (size_t) _start;
      size_t newSize;
      if (_objectSizeIsPowerOfTwo) {
	newSize = _objectSize - (offset & (_objectSize - 1));
      } else {
	newSize = _objectSize - (offset % _objectSize);
      }
      return newSize;
    }